

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O3

btVector3 ThreePlaneIntersection(btPlane *p0,btPlane *p1,btPlane *p2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  btVector3 bVar20;
  
  fVar1 = (p0->normal).m_floats[2];
  fVar2 = (p2->normal).m_floats[2];
  uVar7 = *(undefined8 *)(p0->normal).m_floats;
  uVar8 = *(undefined8 *)(p1->normal).m_floats;
  uVar9 = *(undefined8 *)(p2->normal).m_floats;
  fVar12 = (float)uVar9;
  fVar14 = (float)((ulong)uVar9 >> 0x20);
  fVar3 = (p1->normal).m_floats[2];
  fVar10 = (float)uVar7;
  fVar11 = (float)((ulong)uVar7 >> 0x20);
  fVar15 = (float)uVar8;
  fVar16 = (float)((ulong)uVar8 >> 0x20);
  fVar18 = fVar3 * fVar12 - fVar2 * fVar15;
  fVar19 = fVar15 * fVar14 - fVar12 * fVar16;
  fVar4 = p0->dist;
  fVar5 = p2->dist;
  fVar6 = p1->dist;
  fVar17 = fVar2 * fVar16 - fVar14 * fVar3;
  fVar13 = -1.0 / (fVar19 * fVar1 + fVar17 * fVar10 + fVar11 * fVar18);
  bVar20.m_floats[0] =
       (fVar4 * fVar17 + (fVar14 * fVar1 - fVar11 * fVar2) * fVar6 +
       fVar5 * (fVar3 * fVar11 - fVar16 * fVar1)) * fVar13;
  bVar20.m_floats[1] =
       fVar13 * (fVar5 * (fVar1 * fVar15 - fVar3 * fVar10) +
                fVar6 * (fVar2 * fVar10 - fVar1 * fVar12) + fVar4 * fVar18);
  bVar20.m_floats[2] =
       fVar13 * (fVar5 * (fVar10 * fVar16 - fVar15 * fVar11) +
                fVar6 * (fVar12 * fVar11 - fVar10 * fVar14) + fVar4 * fVar19);
  bVar20.m_floats[3] = 0.0;
  return (btVector3)bVar20.m_floats;
}

Assistant:

btVector3  ThreePlaneIntersection(const btPlane &p0,const btPlane &p1, const btPlane &p2)
{
	btVector3 N1 = p0.normal;
	btVector3 N2 = p1.normal;
	btVector3 N3 = p2.normal;

	btVector3 n2n3; n2n3 = N2.cross(N3);
	btVector3 n3n1; n3n1 = N3.cross(N1);
	btVector3 n1n2; n1n2 = N1.cross(N2);

	btScalar quotient = (N1.dot(n2n3));

	btAssert(btFabs(quotient) > btScalar(0.000001));
	
	quotient = btScalar(-1.) / quotient;
	n2n3 *= p0.dist;
	n3n1 *= p1.dist;
	n1n2 *= p2.dist;
	btVector3 potentialVertex = n2n3;
	potentialVertex += n3n1;
	potentialVertex += n1n2;
	potentialVertex *= quotient;

	btVector3 result(potentialVertex.getX(),potentialVertex.getY(),potentialVertex.getZ());
	return result;

}